

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::MILSpec::TensorValue::_InternalParse
          (TensorValue *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  TensorValue_RepeatedStrings *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar4;
  Arena *pAVar5;
  char cVar6;
  uint res;
  pair<const_char_*,_unsigned_int> pVar7;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_38;
      res = (uint)bVar1;
      pbVar4 = local_38 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar4 * 0x80) - 0x80;
        if ((char)*pbVar4 < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_38,res);
          pbVar4 = (byte *)pVar7.first;
          res = pVar7.second;
        }
        else {
          pbVar4 = local_38 + 2;
        }
      }
      cVar6 = (char)res;
      local_38 = pbVar4;
      switch(res >> 3) {
      case 1:
        if (cVar6 != '\n') break;
        if (this->_oneof_case_[0] == 1) goto LAB_00210277;
        clear_value(this);
        this->_oneof_case_[0] = 1;
        uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          pAVar5 = *(Arena **)pAVar5;
        }
        msg = (TensorValue_RepeatedStrings *)
              google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>(pAVar5)
        ;
LAB_002102de:
        (this->value_).bytes_ = (TensorValue_RepeatedBytes *)msg;
LAB_002102e9:
        local_38 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg->super_MessageLite,(char *)local_38);
        goto LAB_002102f4;
      case 2:
        if (cVar6 == '\x12') {
          if (this->_oneof_case_[0] != 2) {
            clear_value(this);
            this->_oneof_case_[0] = 2;
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = (TensorValue_RepeatedStrings *)
                  google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>
                            (pAVar5);
            goto LAB_002102de;
          }
LAB_00210277:
          msg = (TensorValue_RepeatedStrings *)(this->value_).floats_;
          goto LAB_002102e9;
        }
        break;
      case 3:
        if (cVar6 == '\x1a') {
          if (this->_oneof_case_[0] != 3) {
            clear_value(this);
            this->_oneof_case_[0] = 3;
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = (TensorValue_RepeatedStrings *)
                  google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                            (pAVar5);
            goto LAB_002102de;
          }
          goto LAB_00210277;
        }
        break;
      case 4:
        if (cVar6 == '\"') {
          if (this->_oneof_case_[0] != 4) {
            clear_value(this);
            this->_oneof_case_[0] = 4;
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                            (pAVar5);
            goto LAB_002102de;
          }
          goto LAB_00210277;
        }
        break;
      case 5:
        if (cVar6 == '*') {
          if (this->_oneof_case_[0] != 5) {
            clear_value(this);
            this->_oneof_case_[0] = 5;
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = (TensorValue_RepeatedStrings *)
                  google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                            (pAVar5);
            goto LAB_002102de;
          }
          goto LAB_00210277;
        }
        break;
      case 6:
        if (cVar6 == '2') {
          if (this->_oneof_case_[0] != 6) {
            clear_value(this);
            this->_oneof_case_[0] = 6;
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = (TensorValue_RepeatedStrings *)
                  google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                            (pAVar5);
            goto LAB_002102de;
          }
          goto LAB_00210277;
        }
        break;
      case 7:
        if (cVar6 == ':') {
          if (this->_oneof_case_[0] != 7) {
            clear_value(this);
            this->_oneof_case_[0] = 7;
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = (TensorValue_RepeatedStrings *)
                  google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                            (pAVar5);
            goto LAB_002102de;
          }
          goto LAB_00210277;
        }
      }
      if ((res == 0) || ((res & 7) == 4)) {
        if (pbVar4 == (byte *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)pbVar4;
      }
      uVar2 = this_00->ptr_;
      if ((uVar2 & 1) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((uVar2 & 0xfffffffffffffffc) + 8);
      }
      local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (res,unknown,(char *)local_38,ctx);
LAB_002102f4:
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_38;
}

Assistant:

const char* TensorValue::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_floats(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_ints(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_bools(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_strings(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_longints(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 50)) {
          ptr = ctx->ParseMessage(_internal_mutable_doubles(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_bytes(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}